

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O3

void __thiscall
HawkTracer::parser::EventKlass::add_field
          (EventKlass *this,
          unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
          *field)

{
  EventKlassField *pEVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  shared_ptr<HawkTracer::parser::EventKlassField> local_50;
  undefined1 local_40 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    pEVar1 = (field->_M_t).
             super___uniq_ptr_impl<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::parser::EventKlassField_*,_std::default_delete<HawkTracer::parser::EventKlassField>_>
             .super__Head_base<0UL,_HawkTracer::parser::EventKlassField_*,_false>._M_head_impl;
    lVar2 = *(long *)&(pEVar1->_name)._M_dataplus;
    local_50.super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar2,(pEVar1->_name)._M_string_length + lVar2);
    _get_field((EventKlass *)(local_40 + 0x10),(char *)this,
               SUB81(local_50.
                     super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,0));
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_50.super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)local_40) {
      operator_delete(local_50.
                      super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
    }
    if (local_40._16_8_ == 0) {
      std::__shared_ptr<HawkTracer::parser::EventKlassField,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>,void>
                ((__shared_ptr<HawkTracer::parser::EventKlassField,(__gnu_cxx::_Lock_policy)2> *)
                 &local_50,field);
      std::
      vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>>>
      ::emplace_back<std::shared_ptr<HawkTracer::parser::EventKlassField>>
                ((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>>>
                  *)&this->_fields,&local_50);
      if (local_50.
          super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar3);
  if (local_50.super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void EventKlass::add_field(std::unique_ptr<EventKlassField> field)
{
    std::lock_guard<std::mutex> l(_fields_mtx);
    if (!_get_field(field->get_name().c_str(), false))
    {
        _fields.push_back(std::move(field));
    }
}